

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Appearance_PDU::Decode(Appearance_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  byte bVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  allocator<char> local_49;
  KString local_48;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (iVar3 + (uint)KVar2 < 0x11) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
    KException::KException(this_00,&local_48,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
  this->m_AppearanceFlag1Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag1Union)0x0;
  this->m_AppearanceFlag2Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag2Union)0x0;
  KDataStream::Read(stream,&(this->m_AppearanceFlag1Union).m_ui8Flag);
  bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  if ((char)bVar1 < '\0') {
    KDataStream::Read(stream,&(this->m_AppearanceFlag2Union).m_ui8Flag);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 1) != 0) {
    KDataStream::Read(stream,&this->m_ui8ForceID);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 2) != 0) {
    (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityType,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 4) != 0) {
    (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AltEntityType,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 8) != 0) {
    (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityMarking,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x10) != 0) {
    (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityCapabilities,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x20) != 0) {
    (*(this->m_VisApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_VisApp,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x40) != 0) {
    (*(this->m_IRApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_IRApp,stream);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((char)bVar1 < '\0') {
    bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    if ((bVar1 & 1) != 0) {
      (*(this->m_EMApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EMApp,stream);
      bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    }
    if ((bVar1 & 2) != 0) {
      (*(this->m_AudApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AudApp,stream);
      return;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < APPEARANCE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    // Reset flags
    m_AppearanceFlag1Union.m_ui8Flag = 0;
    m_AppearanceFlag2Union.m_ui8Flag = 0;

    stream >> m_AppearanceFlag1Union.m_ui8Flag;

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        stream >> m_AppearanceFlag2Union.m_ui8Flag;
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        stream >> m_ui8ForceID;
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        stream >> KDIS_STREAM m_EntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        stream >> KDIS_STREAM m_AltEntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        stream >> KDIS_STREAM m_EntityMarking;
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        stream >> KDIS_STREAM m_EntityCapabilities;
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        stream >> KDIS_STREAM m_VisApp;
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        stream >> KDIS_STREAM m_IRApp;
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            stream >> KDIS_STREAM m_EMApp;
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            stream >> KDIS_STREAM m_AudApp;
        }
    }
}